

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,string *binDir)

{
  bool bVar1;
  long lVar2;
  unsigned_long uVar3;
  char *pcVar4;
  string *psVar5;
  ulong dindex;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  Directory dir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  string m;
  string fullPath;
  Directory DStack_b8;
  cmCoreTryCompile *local_b0;
  string *local_a8;
  undefined1 local_a0 [32];
  _Base_ptr local_80;
  size_t local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (binDir->_M_string_length != 0) {
    local_b0 = this;
    lVar2 = std::__cxx11::string::find((char *)binDir,0x4391a2);
    if (lVar2 == -1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp:",
                     binDir);
      cmSystemTools::Error
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
    else {
      cmsys::Directory::Directory(&DStack_b8);
      local_a8 = binDir;
      cmsys::Directory::Load(&DStack_b8,binDir);
      local_a0._24_8_ = local_a0 + 8;
      local_a0._8_4_ = _S_red;
      local_a0._16_8_ = (_Base_ptr)0x0;
      local_78 = 0;
      dindex = 0;
      local_80 = (_Base_ptr)local_a0._24_8_;
      while( true ) {
        uVar3 = cmsys::Directory::GetNumberOfFiles(&DStack_b8);
        if (uVar3 <= dindex) break;
        pcVar4 = cmsys::Directory::GetFile(&DStack_b8,dindex);
        if ((*pcVar4 != '.') || ((pcVar4[1] != '\0' && ((pcVar4[1] != '.' || (pcVar4[2] != '\0')))))
           ) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,pcVar4,(allocator<char> *)&local_70);
          pVar6 = std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_a0,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::__cxx11::string::string((string *)&local_70,(string *)local_a8);
            pcVar4 = (char *)std::__cxx11::string::append((char *)&local_70);
            psVar5 = (string *)std::__cxx11::string::append(pcVar4);
            std::__cxx11::string::string((string *)&local_50,psVar5);
            std::__cxx11::string::~string((string *)&local_70);
            bVar1 = cmsys::SystemTools::FileIsDirectory(&local_50);
            if (bVar1) {
              CleanupFiles(local_b0,&local_50);
              cmsys::SystemTools::RemoveADirectory(&local_50);
            }
            else {
              bVar1 = cmsys::SystemTools::RemoveFile(&local_50);
              if (!bVar1) {
                std::operator+(&local_70,"Remove failed on file: ",&local_50);
                cmSystemTools::ReportLastSystemError(local_70._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&local_70);
              }
            }
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
        dindex = dindex + 1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a0);
      cmsys::Directory::~Directory(&DStack_b8);
    }
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(std::string const& binDir)
{
  if (binDir.empty()) {
    return;
  }

  if (binDir.find("CMakeTmp") == std::string::npos) {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp:" +
      binDir);
    return;
  }

  cmsys::Directory dir;
  dir.Load(binDir);
  std::set<std::string> deletedFiles;
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0) {
      if (deletedFiles.insert(fileName).second) {
        std::string const fullPath =
          std::string(binDir).append("/").append(fileName);
        if (cmSystemTools::FileIsDirectory(fullPath)) {
          this->CleanupFiles(fullPath);
          cmSystemTools::RemoveADirectory(fullPath);
        } else {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          while (!cmSystemTools::RemoveFile(fullPath) && --retry.Count &&
                 cmSystemTools::FileExists(fullPath)) {
            cmSystemTools::Delay(retry.Delay);
          }
          if (retry.Count == 0)
#else
          if (!cmSystemTools::RemoveFile(fullPath))
#endif
          {
            std::string m = "Remove failed on file: " + fullPath;
            cmSystemTools::ReportLastSystemError(m.c_str());
          }
        }
      }
    }
  }
}